

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O1

size_t __thiscall
MADPComponentDiscreteActions::GetNrJointActions(MADPComponentDiscreteActions *this,Scope *agScope)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_long uVar3;
  long lVar4;
  ulong uVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> restr_nrAs;
  allocator_type local_29;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  lVar4 = (long)(agScope->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(agScope->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 == 0) {
    uVar3 = 0;
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_28,lVar4 >> 2,&local_29);
    puVar1 = (agScope->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(agScope->super_SDT).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1;
    if (lVar4 != 0) {
      puVar2 = (this->_m_nrActions).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = 0;
      do {
        local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] = (ulong)(uint)puVar2[puVar1[uVar5]];
        uVar5 = uVar5 + 1;
      } while ((uVar5 & 0xffffffff) < (ulong)(lVar4 >> 2));
    }
    uVar3 = VectorTools::VectorProduct<unsigned_long>(&local_28);
    if (local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_28.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return uVar3;
}

Assistant:

size_t MADPComponentDiscreteActions::GetNrJointActions(const Scope& agScope) const
{
    if(agScope.size()>0)
    {
        const vector<size_t>& nrActions = GetNrActions();
        vector<size_t> restr_nrAs(agScope.size());
        IndexTools::RestrictIndividualIndicesToScope(
            nrActions, agScope, restr_nrAs);
        size_t restr_nrJA = VectorTools::VectorProduct(restr_nrAs);
        return restr_nrJA;
    }
    else
        return(0);
}